

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptArray * __thiscall
Js::JavascriptLibrary::CreateArrayLiteral(JavascriptLibrary *this,uint32 length)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptArray *this_00;
  DynamicType *arrayType;
  
  arrayType = (this->arrayType).ptr;
  if (arrayType == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x175e,"(arrayType)","Where\'s arrayType?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    arrayType = (this->arrayType).ptr;
  }
  this_00 = JavascriptArray::NewLiteral<void*,Js::JavascriptArray,0u>
                      (length,arrayType,this->recycler);
  JavascriptArray::CheckForceES5Array(this_00);
  return this_00;
}

Assistant:

JavascriptArray* JavascriptLibrary::CreateArrayLiteral(uint32 length)
    {
        AssertMsg(arrayType, "Where's arrayType?");
        JavascriptArray* arr = JavascriptArray::NewLiteral<Var, JavascriptArray, 0>(length, arrayType, this->GetRecycler());
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_ARRAY(arr));

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif
        return arr;
    }